

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O3

char * test_database_path(char *filename)

{
  char *pcVar1;
  char *pcVar2;
  char cwd [500];
  char acStack_218 [512];
  
  getcwd(acStack_218,500);
  pcVar1 = __xpg_basename(acStack_218);
  if (*pcVar1 == 't') {
    pcVar2 = "./t/maxmind-db/test-data";
    if (pcVar1[1] == '\0') {
      pcVar2 = "./maxmind-db/test-data";
    }
  }
  else {
    pcVar2 = "./t/maxmind-db/test-data";
  }
  pcVar1 = (char *)malloc(500);
  if (pcVar1 == (char *)0x0) {
    __assert_fail("NULL != path",
                  "/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                  ,0x42,"char *test_database_path(const char *)");
  }
  snprintf(pcVar1,500,"%s/%s",pcVar2,filename);
  return pcVar1;
}

Assistant:

char *test_database_path(const char *filename) {
    char *test_db_dir;
#ifdef _WIN32
    test_db_dir = "../t/maxmind-db/test-data";
#else
    char cwd[500];
    char *UNUSED(tmp) = getcwd(cwd, 500);

    if (strcmp(basename(cwd), "t") == 0) {
        test_db_dir = "./maxmind-db/test-data";
    } else {
        test_db_dir = "./t/maxmind-db/test-data";
    }
#endif

    char *path = malloc(500);
    assert(NULL != path);

    snprintf(path, 500, "%s/%s", test_db_dir, filename);

    return path;
}